

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O2

int next_fd(int *state,int *rwx)

{
  tree234 *t;
  int iVar1;
  int *piVar2;
  
  t = fds;
  iVar1 = *state;
  *state = iVar1 + 1;
  piVar2 = (int *)index234(t,iVar1);
  if (piVar2 == (int *)0x0) {
    iVar1 = -1;
  }
  else {
    *rwx = piVar2[1];
    iVar1 = *piVar2;
  }
  return iVar1;
}

Assistant:

int next_fd(int *state, int *rwx)
{
    struct fd *fd;
    fd = index234(fds, (*state)++);
    if (fd) {
        *rwx = fd->rwx;
        return fd->fd;
    } else
        return -1;
}